

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  N_Vector v;
  N_Vector v_00;
  SUNMatrix A_00;
  long lVar7;
  realtype *prVar8;
  bool bVar9;
  sunindextype n;
  sunindextype m;
  sunindextype j;
  sunindextype i;
  int square;
  int print_timing;
  realtype *Idata;
  realtype *Adata;
  SUNMatrix I;
  SUNMatrix A;
  realtype *ydata;
  realtype *xdata;
  N_Vector y;
  N_Vector x;
  sunindextype matcols;
  sunindextype matrows;
  int fails;
  char **argv_local;
  int argc_local;
  
  if (argc < 4) {
    printf("ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing \n");
    argv_local._4_4_ = 0xffffffff;
  }
  else {
    lVar5 = atol(argv[1]);
    if (lVar5 < 1) {
      printf("ERROR: number of rows must be a positive integer \n");
      argv_local._4_4_ = 0xffffffff;
    }
    else {
      lVar6 = atol(argv[2]);
      if (lVar6 < 1) {
        printf("ERROR: number of cols must be a positive integer \n");
        argv_local._4_4_ = 0xffffffff;
      }
      else {
        iVar1 = atoi(argv[3]);
        SetTiming(iVar1);
        bVar9 = lVar5 == lVar6;
        printf("\nDense matrix test: size %ld by %ld\n\n",lVar5,lVar6);
        v = (N_Vector)N_VNew_Serial(lVar6);
        v_00 = (N_Vector)N_VNew_Serial(lVar5);
        A_00 = (SUNMatrix)SUNDenseMatrix(lVar5,lVar6);
        Adata = (realtype *)0x0;
        if (bVar9) {
          Adata = (realtype *)SUNDenseMatrix(lVar5,lVar6);
        }
        lVar7 = SUNDenseMatrix_Data(A_00);
        for (m = 0; m < lVar6; m = m + 1) {
          for (j = 0; j < lVar5; j = j + 1) {
            *(double *)(lVar7 + (m * lVar5 + j) * 8) = (double)((m + 1) * (j + m));
          }
        }
        if (bVar9) {
          lVar7 = SUNDenseMatrix_Data(Adata);
          m = 0;
          for (j = 0; j < lVar5; j = j + 1) {
            *(undefined8 *)(lVar7 + (m * lVar5 + j) * 8) = 0x3ff0000000000000;
            m = m + 1;
          }
        }
        prVar8 = N_VGetArrayPointer(v);
        for (j = 0; j < lVar6; j = j + 1) {
          prVar8[j] = 1.0 / (double)(j + 1);
        }
        prVar8 = N_VGetArrayPointer(v_00);
        for (j = 0; j < lVar5; j = j + 1) {
          prVar8[j] = (double)((j + lVar6) - j) * 0.5 * (double)(j + lVar6 + -1 + j);
        }
        iVar1 = Test_SUNMatGetID(A_00,SUNMATRIX_DENSE,0);
        iVar2 = Test_SUNMatClone(A_00,0);
        iVar3 = Test_SUNMatCopy(A_00,0);
        iVar4 = Test_SUNMatZero(A_00,0);
        matrows._4_4_ = iVar4 + iVar3 + iVar2 + iVar1;
        if (bVar9) {
          iVar1 = Test_SUNMatScaleAdd(A_00,(SUNMatrix)Adata,0);
          iVar2 = Test_SUNMatScaleAddI(A_00,(SUNMatrix)Adata,0);
          matrows._4_4_ = iVar2 + iVar1 + matrows._4_4_;
        }
        iVar1 = Test_SUNMatMatvec(A_00,v,v_00,0);
        iVar2 = Test_SUNMatSpace(A_00,0);
        argv_local._4_4_ = iVar2 + iVar1 + matrows._4_4_;
        if (argv_local._4_4_ == 0) {
          printf("SUCCESS: SUNMatrix module passed all tests \n \n");
        }
        else {
          printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)argv_local._4_4_);
          printf("\nA =\n");
          SUNDenseMatrix_Print(A_00,_stdout);
          if (bVar9) {
            printf("\nI =\n");
            SUNDenseMatrix_Print(Adata,_stdout);
          }
          printf("\nx =\n");
          N_VPrint_Serial(v);
          printf("\ny =\n");
          N_VPrint_Serial(v_00);
        }
        N_VDestroy_Serial(v);
        N_VDestroy_Serial(v_00);
        SUNMatDestroy(A_00);
        if (bVar9) {
          SUNMatDestroy((SUNMatrix)Adata);
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) 
{
  int          fails = 0;        /* counter for test failures  */
  sunindextype matrows, matcols; /* vector length              */
  N_Vector     x, y;             /* test vectors               */
  realtype     *xdata, *ydata;   /* pointers to vector data    */
  SUNMatrix    A, I;             /* test matrices              */
  realtype     *Adata, *Idata;   /* pointers to matrix data    */
  int          print_timing, square;
  sunindextype i, j, m, n;

  /* check input and set vector length */
  if (argc < 4){
    printf("ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing \n");
    return(-1);
  }
  
  matrows = atol(argv[1]); 
  if (matrows <= 0) {
    printf("ERROR: number of rows must be a positive integer \n");
    return(-1); 
  }
  
  matcols = atol(argv[2]); 
  if (matcols <= 0) {
    printf("ERROR: number of cols must be a positive integer \n");
    return(-1); 
  }

  print_timing = atoi(argv[3]);
  SetTiming(print_timing);
  
  square = (matrows == matcols) ? 1 : 0;
  printf("\nDense matrix test: size %ld by %ld\n\n",
         (long int) matrows, (long int) matcols);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;
  
  /* Create vectors and matrices */
  x = N_VNew_Serial(matcols);
  y = N_VNew_Serial(matrows);
  A = SUNDenseMatrix(matrows, matcols);
  I = NULL;
  if (square)
    I = SUNDenseMatrix(matrows, matcols);
  
  /* Fill matrices and vectors */
  Adata = SUNDenseMatrix_Data(A);
  for(j=0; j < matcols; j++) {
    for(i=0; i < matrows; i++) {
      Adata[j*matrows + i] = (j+1)*(i+j);
    }
  }

  if (square) {
    Idata = SUNDenseMatrix_Data(I);
    for(i=0, j=0; i < matrows; i++, j++) {
      Idata[j*matrows + i] = ONE;
    }
  }

  xdata = N_VGetArrayPointer(x);
  for(i=0; i < matcols; i++) {
    xdata[i] = ONE / (i+1);
  }

  ydata = N_VGetArrayPointer(y);
  for(i=0; i < matrows; i++) {
    m = i;
    n = m + matcols - 1;
    ydata[i] = HALF*(n+1-m)*(n+m);
  }
    
  /* SUNMatrix Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_DENSE, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  if (square) {
    fails += Test_SUNMatScaleAdd(A, I, 0);
    fails += Test_SUNMatScaleAddI(A, I, 0);
  }
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails) {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNDenseMatrix_Print(A,stdout);
    if (square) {
      printf("\nI =\n");
      SUNDenseMatrix_Print(I,stdout);
    }
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  } else {
    printf("SUCCESS: SUNMatrix module passed all tests \n \n");
  }

  /* Free vectors and matrices */
  N_VDestroy_Serial(x);
  N_VDestroy_Serial(y);
  SUNMatDestroy(A);
  if (square)
    SUNMatDestroy(I);

  return(fails);
}